

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes3.cc
# Opt level: O3

string * __thiscall Node::ParenString_abi_cxx11_(string *__return_storage_ptr__,Node *this)

{
  char cVar1;
  long lVar2;
  undefined8 *puVar3;
  long *plVar4;
  size_type *psVar5;
  ulong uVar6;
  undefined8 uVar7;
  long *local_78;
  undefined8 local_70;
  long local_68;
  undefined8 uStack_60;
  string local_58;
  ulong *local_38;
  long local_30;
  ulong local_28 [2];
  
  cVar1 = *(this->TextValue)._M_dataplus._M_p;
  if ((cVar1 == '\'') || (cVar1 == '\"')) {
    local_38 = local_28;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"std::string(","");
    Expression_abi_cxx11_(&local_58,this);
    uVar6 = 0xf;
    if (local_38 != local_28) {
      uVar6 = local_28[0];
    }
    if (uVar6 < local_58._M_string_length + local_30) {
      uVar7 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        uVar7 = local_58.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar7 < local_58._M_string_length + local_30) goto LAB_00117773;
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,(ulong)local_38);
    }
    else {
LAB_00117773:
      puVar3 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_38,(ulong)local_58._M_dataplus._M_p);
    }
    local_78 = &local_68;
    plVar4 = puVar3 + 2;
    if ((long *)*puVar3 == plVar4) {
      local_68 = *plVar4;
      uStack_60 = puVar3[3];
    }
    else {
      local_68 = *plVar4;
      local_78 = (long *)*puVar3;
    }
    local_70 = puVar3[1];
    *puVar3 = plVar4;
    puVar3[1] = 0;
    *(undefined1 *)plVar4 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_78);
    goto LAB_001178f1;
  }
  if ((this->Type != 0x2d) && (this->Type != 0x2b)) {
    Expression_abi_cxx11_(__return_storage_ptr__,this);
    return __return_storage_ptr__;
  }
  local_38 = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"(","");
  Expression_abi_cxx11_(&local_58,this);
  uVar6 = 0xf;
  if (local_38 != local_28) {
    uVar6 = local_28[0];
  }
  if (uVar6 < local_58._M_string_length + local_30) {
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      uVar7 = local_58.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar7 < local_58._M_string_length + local_30) goto LAB_0011780a;
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,(ulong)local_38);
  }
  else {
LAB_0011780a:
    puVar3 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_38,(ulong)local_58._M_dataplus._M_p);
  }
  local_78 = &local_68;
  plVar4 = puVar3 + 2;
  if ((long *)*puVar3 == plVar4) {
    local_68 = *plVar4;
    uStack_60 = puVar3[3];
  }
  else {
    local_68 = *plVar4;
    local_78 = (long *)*puVar3;
  }
  local_70 = puVar3[1];
  *puVar3 = plVar4;
  puVar3[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_78);
LAB_001178f1:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar5 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar5) {
    lVar2 = plVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
  }
  __return_storage_ptr__->_M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_78 != &local_68) {
    operator_delete(local_78,local_68 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Node::ParenString(void)
{
	if (TextValue[0] == '"' || TextValue[0] == '\'')
	{
		return std::string("std::string(") +
			Expression() + ")";
	}
	else
	{
		switch(Type)
		{
		// Add other operations as needed
		case '+':
		case '-':
			return std::string("(") + Expression() + ")";

	//	case  '(':
		default:
			return Expression();
		}
	}
}